

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O2

void __thiscall
nigel::Preprocessor::processFile
          (Preprocessor *this,CodeBase *base,shared_ptr<boost::filesystem::path> *path,
          vector<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
          *result,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *definitions,size_t *ifdefCount,bool *ignoreifdef,size_t *posAtIgnore)

{
  bool bVar1;
  istream *piVar2;
  _Base_ptr p_Var3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  mapped_type *pmVar7;
  size_t sVar8;
  iterator iVar9;
  byte bVar10;
  char cVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  size_t local_5a8;
  String def;
  key_type local_568;
  _Base_ptr local_548;
  String identifier;
  String str;
  path local_4f0;
  CodeBase *local_4d0;
  __shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2> local_4c8;
  undefined1 local_4b8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4a0;
  undefined1 local_498 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_480;
  undefined1 local_478 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_460;
  undefined1 local_458 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_440;
  undefined1 local_438 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_420;
  undefined1 local_418 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_400;
  undefined1 local_3f8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3e0;
  undefined1 local_3d8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3c0;
  undefined1 local_3b8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3a0;
  undefined1 local_398 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_380;
  undefined1 local_378 [32];
  __shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2> local_358;
  __shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2> local_348;
  __shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2> local_338;
  __shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2> local_328;
  __shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2> local_318;
  __shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2> local_308;
  __shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2> local_2f8;
  __shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2> local_2e8;
  __shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2> local_2d8;
  __shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2> local_2c8;
  __shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2> local_2b8;
  __shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2> local_2a8;
  __shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2> local_298;
  __shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2> local_288;
  __shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2> local_278;
  __shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2> local_268;
  __shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2> local_258;
  __shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2> local_248;
  ifstream filestream;
  byte abStack_218 [488];
  
  local_4d0 = base;
  std::ifstream::ifstream
            (&filestream,
             (string *)
             (path->super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
             _S_bin);
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  local_548 = &(definitions->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_5a8 = 0;
  do {
    if (((abStack_218[*(long *)(_filestream + -0x18)] & 5) != 0) ||
       (piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&filestream,(string *)&str),
       ((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0)) {
      std::__cxx11::string::~string((string *)&str);
      std::ifstream::~ifstream(&filestream);
      return;
    }
    local_5a8 = local_5a8 + 1;
    while (str._M_string_length != 0) {
      uVar5 = (ulong)(byte)*str._M_dataplus._M_p;
      cVar11 = (char)&str;
      if (0x23 < uVar5) {
LAB_0017a1db:
        if (*ignoreifdef == false) {
          std::__cxx11::string::string((string *)&identifier,"\r",(allocator *)&local_568);
          def._M_dataplus._M_p = (pointer)&def.field_2;
          def._M_string_length = 0;
          def.field_2._M_local_buf[0] = '\0';
          helper::replace<std::__cxx11::string>
                    (&str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &identifier,&def);
          std::__cxx11::string::~string((string *)&def);
          std::__cxx11::string::~string((string *)&identifier);
          std::__cxx11::string::push_back(cVar11);
          for (p_Var3 = (definitions->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              p_Var3 != local_548; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
            helper::replace<std::__cxx11::string>
                      (&str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (p_Var3 + 1),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var3 + 2));
          }
          std::__cxx11::string::string((string *)&identifier,"__FILE__",(allocator *)&def);
          helper::replace<std::__cxx11::string>
                    (&str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &identifier,
                     &((path->
                       super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->m_pathname);
          std::__cxx11::string::~string((string *)&identifier);
          std::__cxx11::string::string((string *)&identifier,"__LINE__",(allocator *)&local_568);
          std::__cxx11::to_string(&def,local_5a8);
          helper::replace<std::__cxx11::string>
                    (&str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &identifier,&def);
          std::__cxx11::string::~string((string *)&def);
          std::__cxx11::string::~string((string *)&identifier);
          std::__cxx11::string::string((string *)&identifier,"__TIME__",(allocator *)&local_568);
          std::__cxx11::string::string((string *)&def,"",(allocator *)&local_4f0);
          helper::replace<std::__cxx11::string>
                    (&str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &identifier,&def);
          std::__cxx11::string::~string((string *)&def);
          std::__cxx11::string::~string((string *)&identifier);
          std::__cxx11::string::string((string *)&identifier,"__DATE__",(allocator *)&local_568);
          std::__cxx11::string::string((string *)&def,"",(allocator *)&local_4f0);
          helper::replace<std::__cxx11::string>
                    (&str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &identifier,&def);
          std::__cxx11::string::~string((string *)&def);
          std::__cxx11::string::~string((string *)&identifier);
          std::make_shared<std::__cxx11::string,std::__cxx11::string&>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378)
          ;
          std::__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_4c8,
                     &path->super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>)
          ;
          CodeBase::LineContent::LineContent
                    ((LineContent *)&identifier,
                     (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_378,(shared_ptr<boost::filesystem::path> *)&local_4c8,local_5a8);
          std::vector<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>::
          emplace_back<nigel::CodeBase::LineContent>(result,(LineContent *)&identifier);
          CodeBase::LineContent::~LineContent((LineContent *)&identifier);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4c8._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_378 + 8));
        }
        break;
      }
      if ((0x100002600U >> (uVar5 & 0x3f) & 1) == 0) {
        if (uVar5 != 0x23) goto LAB_0017a1db;
        if (str._M_string_length == 1) {
          std::make_shared<std::__cxx11::string,std::__cxx11::string&>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b8)
          ;
          std::__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2> *)
                     (local_378 + 0x10),
                     &path->super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>)
          ;
          BuilderExecutable::generateNotification
                    (&this->super_BuilderExecutable,warn_emptyDirective,
                     (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_4b8,local_5a8,
                     (shared_ptr<boost::filesystem::path> *)(local_378 + 0x10));
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_378 + 0x18));
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_4b8 + 8));
          break;
        }
        if (*ignoreifdef == true) {
          lVar4 = std::__cxx11::string::find((char *)&str,0x180ab3);
          if ((lVar4 == 1) ||
             (lVar4 = std::__cxx11::string::find((char *)&str,0x180ab9), lVar4 == 1)) {
            *ifdefCount = *ifdefCount + 1;
          }
          lVar4 = std::__cxx11::string::find((char *)&str,0x180ac0);
          if (lVar4 == 1) {
            if (*ifdefCount == 0) {
              std::make_shared<std::__cxx11::string,std::__cxx11::string&>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_398 + 0x10));
              std::__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&local_248,
                         &path->
                          super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>);
              BuilderExecutable::generateNotification
                        (&this->super_BuilderExecutable,err_elseifWithoutIfdef,
                         (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)(local_398 + 0x10),local_5a8,
                         (shared_ptr<boost::filesystem::path> *)&local_248);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_248._M_refcount);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_380);
            }
            else if (*posAtIgnore == *ifdefCount) {
              *ignoreifdef = false;
            }
          }
          else {
            lVar4 = std::__cxx11::string::find((char *)&str,0x180ac7);
            if (lVar4 == 1) {
              sVar8 = *ifdefCount;
              if (sVar8 == 0) {
                std::make_shared<std::__cxx11::string,std::__cxx11::string&>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_398);
                std::__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                          (&local_258,
                           &path->
                            super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>)
                ;
                BuilderExecutable::generateNotification
                          (&this->super_BuilderExecutable,err_endifWithoutIfdef,
                           (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_398,local_5a8,(shared_ptr<boost::filesystem::path> *)&local_258)
                ;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&local_258._M_refcount);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_398 + 8));
              }
              else {
LAB_0017a606:
                if (*posAtIgnore == sVar8) {
                  *ignoreifdef = false;
                }
                *ifdefCount = sVar8 - 1;
              }
            }
          }
          break;
        }
        lVar4 = std::__cxx11::string::find((char *)&str,0x180acd);
        if (lVar4 == 1) {
          if (str._M_string_length < 9) {
            std::make_shared<std::__cxx11::string,std::__cxx11::string&>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_3b8 + 0x10));
            std::__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_268,
                       &path->
                        super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>);
            BuilderExecutable::generateNotification
                      (&this->super_BuilderExecutable,err_incompleteDefineDirective,
                       (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(local_3b8 + 0x10),local_5a8,
                       (shared_ptr<boost::filesystem::path> *)&local_268);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_268._M_refcount)
            ;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3a0);
            break;
          }
          uVar5 = std::__cxx11::string::find(cVar11,10);
          uVar6 = std::__cxx11::string::find(cVar11,0xd);
          if (uVar6 < uVar5) {
            uVar5 = std::__cxx11::string::find(cVar11,0xd);
          }
          uVar6 = std::__cxx11::string::find(cVar11,0x20);
          if (uVar6 < uVar5) {
            std::__cxx11::string::find(cVar11,0x20);
          }
          std::__cxx11::string::substr((ulong)&identifier,(ulong)&str);
          def._M_dataplus._M_p = (pointer)&def.field_2;
          def._M_string_length = 0;
          def.field_2._M_local_buf[0] = '\0';
          if (identifier._M_string_length + 9 < str._M_string_length) {
            uVar5 = std::__cxx11::string::find(cVar11,10);
            uVar6 = std::__cxx11::string::find(cVar11,0xd);
            if (uVar6 < uVar5) {
              std::__cxx11::string::find(cVar11,0xd);
            }
            std::__cxx11::string::substr((ulong)&local_568,(ulong)&str);
            std::__cxx11::string::operator=((string *)&def,(string *)&local_568);
            std::__cxx11::string::~string((string *)&local_568);
          }
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](definitions,(key_type *)&identifier);
          std::__cxx11::string::_M_assign((string *)pmVar7);
LAB_0017a5d0:
          std::__cxx11::string::~string((string *)&def);
        }
        else {
          lVar4 = std::__cxx11::string::find((char *)&str,0x180ad4);
          if (lVar4 == 1) {
            if (str._M_string_length < 8) {
              std::make_shared<std::__cxx11::string,std::__cxx11::string&>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_3d8 + 0x10));
              std::__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&local_288,
                         &path->
                          super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>);
              BuilderExecutable::generateNotification
                        (&this->super_BuilderExecutable,err_incompleteUndefineDirective,
                         (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)(local_3d8 + 0x10),local_5a8,
                         (shared_ptr<boost::filesystem::path> *)&local_288);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_288._M_refcount);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3c0);
              break;
            }
            uVar5 = std::__cxx11::string::find(cVar11,10);
            uVar6 = std::__cxx11::string::find(cVar11,0xd);
            if (uVar6 < uVar5) {
              std::__cxx11::string::find(cVar11,0xd);
            }
            std::__cxx11::string::substr((ulong)&identifier,(ulong)&str);
            iVar9 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::find(&definitions->_M_t,(key_type *)&identifier);
            if (iVar9._M_node == local_548) {
              std::make_shared<std::__cxx11::string,std::__cxx11::string&>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_3b8);
              std::__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&local_278,
                         &path->
                          super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>);
              BuilderExecutable::generateNotification
                        (&this->super_BuilderExecutable,warn_undefinedIdentifiernAtUndefDirective,
                         (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_3b8,local_5a8,(shared_ptr<boost::filesystem::path> *)&local_278);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_278._M_refcount);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3b8 + 8));
            }
            else {
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::erase(&definitions->_M_t,(key_type *)&identifier);
            }
          }
          else {
            lVar4 = std::__cxx11::string::find((char *)&str,0x180ab3);
            if (lVar4 == 1) {
              if (str._M_string_length < 8) {
                std::make_shared<std::__cxx11::string,std::__cxx11::string&>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_3d8);
                std::__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                          (&local_298,
                           &path->
                            super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>)
                ;
                BuilderExecutable::generateNotification
                          (&this->super_BuilderExecutable,err_elseifWithoutIfdef,
                           (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_3d8,local_5a8,(shared_ptr<boost::filesystem::path> *)&local_298)
                ;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&local_298._M_refcount);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3d8 + 8));
                break;
              }
              uVar5 = std::__cxx11::string::find(cVar11,10);
              uVar6 = std::__cxx11::string::find(cVar11,0xd);
              if (uVar6 < uVar5) {
                std::__cxx11::string::find(cVar11,0xd);
              }
              std::__cxx11::string::substr((ulong)&identifier,(ulong)&str);
              *ifdefCount = *ifdefCount + 1;
              iVar9 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::find(&definitions->_M_t,(key_type *)&identifier);
              if (iVar9._M_node == local_548) {
                *ignoreifdef = true;
                *posAtIgnore = *ifdefCount;
              }
            }
            else {
              lVar4 = std::__cxx11::string::find((char *)&str,0x180ab9);
              if (lVar4 == 1) {
                if (str._M_string_length < 9) {
                  std::make_shared<std::__cxx11::string,std::__cxx11::string&>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_3f8 + 0x10));
                  std::__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>::
                  __shared_ptr(&local_2a8,
                               &path->
                                super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                              );
                  BuilderExecutable::generateNotification
                            (&this->super_BuilderExecutable,err_elseifWithoutIfdef,
                             (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)(local_3f8 + 0x10),local_5a8,
                             (shared_ptr<boost::filesystem::path> *)&local_2a8);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&local_2a8._M_refcount);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3e0);
                  break;
                }
                uVar5 = std::__cxx11::string::find(cVar11,10);
                uVar6 = std::__cxx11::string::find(cVar11,0xd);
                if (uVar6 < uVar5) {
                  std::__cxx11::string::find(cVar11,0xd);
                }
                std::__cxx11::string::substr((ulong)&identifier,(ulong)&str);
                *ifdefCount = *ifdefCount + 1;
                iVar9 = std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::find(&definitions->_M_t,(key_type *)&identifier);
                if (iVar9._M_node != local_548) {
                  *ignoreifdef = true;
                  *posAtIgnore = *ifdefCount;
                }
              }
              else {
                lVar4 = std::__cxx11::string::find((char *)&str,0x180ac0);
                if (lVar4 == 1) {
                  sVar8 = *ifdefCount;
                  if (sVar8 == 0) {
                    std::make_shared<std::__cxx11::string,std::__cxx11::string&>
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_3f8);
                    std::__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>::
                    __shared_ptr(&local_2b8,
                                 &path->
                                  super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                );
                    BuilderExecutable::generateNotification
                              (&this->super_BuilderExecutable,err_elseifWithoutIfdef,
                               (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_3f8,local_5a8,
                               (shared_ptr<boost::filesystem::path> *)&local_2b8);
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                              (&local_2b8._M_refcount);
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3f8 + 8));
                  }
                  else if (*ignoreifdef == false) {
                    *ignoreifdef = true;
                    *posAtIgnore = sVar8;
                  }
                  else {
                    *ignoreifdef = false;
                  }
                  break;
                }
                lVar4 = std::__cxx11::string::find((char *)&str,0x180ac7);
                if (lVar4 == 1) {
                  sVar8 = *ifdefCount;
                  if (sVar8 != 0) goto LAB_0017a606;
                  std::make_shared<std::__cxx11::string,std::__cxx11::string&>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_418 + 0x10));
                  std::__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>::
                  __shared_ptr(&local_2c8,
                               &path->
                                super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                              );
                  BuilderExecutable::generateNotification
                            (&this->super_BuilderExecutable,err_endifWithoutIfdef,
                             (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)(local_418 + 0x10),local_5a8,
                             (shared_ptr<boost::filesystem::path> *)&local_2c8);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&local_2c8._M_refcount);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_400);
                  break;
                }
                lVar4 = std::__cxx11::string::find((char *)&str,0x17e4b0);
                if (lVar4 == 1) {
                  uVar5 = std::__cxx11::string::find(cVar11,10);
                  uVar6 = std::__cxx11::string::find(cVar11,0xd);
                  if (uVar6 < uVar5) {
                    std::__cxx11::string::find(cVar11,0xd);
                  }
                  std::__cxx11::string::substr((ulong)&identifier,(ulong)&str);
                  std::make_shared<std::__cxx11::string,std::__cxx11::string&>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_418);
                  std::__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>::
                  __shared_ptr(&local_2d8,
                               &path->
                                super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                              );
                  BuilderExecutable::generateNotification
                            (&this->super_BuilderExecutable,err_errorDirective,
                             (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_418,local_5a8,
                             (shared_ptr<boost::filesystem::path> *)&local_2d8);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&local_2d8._M_refcount);
                  p_Var12 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_418 + 8);
                }
                else {
                  lVar4 = std::__cxx11::string::find((char *)&str,0x17e556);
                  if (lVar4 != 1) {
                    lVar4 = std::__cxx11::string::find((char *)&str,0x180ada);
                    if (lVar4 == 1) {
                      if (10 < str._M_string_length) {
                        std::__cxx11::string::find(cVar11,0x22);
                        std::__cxx11::string::substr((ulong)&identifier,(ulong)&str);
                        std::__cxx11::string::find((char)(LineContent *)&identifier,0x22);
                        std::__cxx11::string::substr((ulong)&local_568,(ulong)&identifier);
                        std::__cxx11::string::string((string *)&def,(string *)&local_568);
                        std::__cxx11::string::~string((string *)&local_568);
                        bVar1 = boost::filesystem::path::has_parent_path
                                          ((path->
                                           super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                           )._M_ptr);
                        if (bVar1) {
                          boost::filesystem::path::parent_path();
                          boost::filesystem::absolute((path *)&local_568,(path *)&def,&local_4f0);
                          std::__cxx11::string::operator=((string *)&def,(string *)&local_568);
                          std::__cxx11::string::~string((string *)&local_568);
                          std::__cxx11::string::~string((string *)&local_4f0);
                        }
                        std::make_shared<boost::filesystem::path,boost::filesystem::path&>
                                  ((path *)local_438);
                        processFile(this,local_4d0,(shared_ptr<boost::filesystem::path> *)local_438,
                                    result,definitions,ifdefCount,ignoreifdef,posAtIgnore);
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_438 + 8));
                        goto LAB_0017a5d0;
                      }
                      std::make_shared<std::__cxx11::string,std::__cxx11::string&>
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_458 + 0x10));
                      std::__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>::
                      __shared_ptr(&local_2f8,
                                   &path->
                                    super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                  );
                      BuilderExecutable::generateNotification
                                (&this->super_BuilderExecutable,err_incompleteIncludeDirective,
                                 (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)(local_458 + 0x10),local_5a8,
                                 (shared_ptr<boost::filesystem::path> *)&local_2f8);
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                (&local_2f8._M_refcount);
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_440);
                    }
                    else {
                      lVar4 = std::__cxx11::string::find((char *)&str,0x180ae2);
                      if (lVar4 == 1) {
                        if (8 < str._M_string_length) {
                          uVar6 = std::__cxx11::string::find(cVar11,10);
                          uVar5 = std::__cxx11::string::find(cVar11,0xd);
                          if (uVar5 < uVar6) {
                            uVar6 = std::__cxx11::string::find(cVar11,0xd);
                          }
                          uVar5 = std::__cxx11::string::find(cVar11,0x20);
                          bVar10 = 0x20;
                          if (uVar5 < uVar6) {
LAB_0017af76:
                            std::__cxx11::string::find(cVar11,(ulong)bVar10);
                          }
                          else {
                            uVar5 = std::__cxx11::string::find(cVar11,0x3d);
                            bVar10 = 0x3d;
                            if (uVar5 < uVar6) goto LAB_0017af76;
                          }
                          std::__cxx11::string::substr((ulong)&identifier,(ulong)&str);
                          def._M_dataplus._M_p = (pointer)&def.field_2;
                          def._M_string_length = 0;
                          def.field_2._M_local_buf[0] = '\0';
                          if (identifier._M_string_length + 9 < str._M_string_length) {
                            uVar5 = std::__cxx11::string::find(cVar11,10);
                            uVar6 = std::__cxx11::string::find(cVar11,0xd);
                            if (uVar6 < uVar5) {
                              std::__cxx11::string::find(cVar11,0xd);
                            }
                            std::__cxx11::string::substr((ulong)&local_568,(ulong)&str);
                            std::__cxx11::string::operator=((string *)&def,(string *)&local_568);
                            std::__cxx11::string::~string((string *)&local_568);
                          }
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&identifier,"memmodel");
                          if (bVar1) {
                            if (def._M_string_length != 0) {
                              bVar1 = std::operator==(&def,"fast");
                              if (bVar1) {
                                std::__cxx11::string::string
                                          ((string *)&local_568,"byte",(allocator *)&local_4f0);
                                pmVar7 = std::
                                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         ::operator[](definitions,&local_568);
                                std::__cxx11::string::assign((char *)pmVar7);
                                std::__cxx11::string::~string((string *)&local_568);
                                std::__cxx11::string::string
                                          ((string *)&local_568,"int",(allocator *)&local_4f0);
                                pmVar7 = std::
                                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         ::operator[](definitions,&local_568);
                                std::__cxx11::string::assign((char *)pmVar7);
                              }
                              else {
                                bVar1 = std::operator==(&def,"norm");
                                if (!bVar1) {
                                  std::make_shared<std::__cxx11::string,std::__cxx11::string&>
                                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)(local_478 + 0x10));
                                  std::
                                  __shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                  ::__shared_ptr(&local_318,
                                                 &path->
                                                  super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                                );
                                  BuilderExecutable::generateNotification
                                            (&this->super_BuilderExecutable,
                                             err_unknownMemModelPragma,
                                             (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)(local_478 + 0x10),local_5a8,
                                             (shared_ptr<boost::filesystem::path> *)&local_318);
                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                            (&local_318._M_refcount);
                                  p_Var12 = &local_460;
                                  goto LAB_0017b45d;
                                }
                                std::__cxx11::string::string
                                          ((string *)&local_568,"byte",(allocator *)&local_4f0);
                                pmVar7 = std::
                                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         ::operator[](definitions,&local_568);
                                std::__cxx11::string::assign((char *)pmVar7);
                                std::__cxx11::string::~string((string *)&local_568);
                                std::__cxx11::string::string
                                          ((string *)&local_568,"int",(allocator *)&local_4f0);
                                pmVar7 = std::
                                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         ::operator[](definitions,&local_568);
                                std::__cxx11::string::assign((char *)pmVar7);
                              }
                              std::__cxx11::string::~string((string *)&local_568);
                              goto LAB_0017a5d0;
                            }
                            std::make_shared<std::__cxx11::string,std::__cxx11::string&>
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_458);
                            std::__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>::
                            __shared_ptr(&local_308,
                                         &path->
                                          super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                        );
                            BuilderExecutable::generateNotification
                                      (&this->super_BuilderExecutable,err_incompleteMemModelPragma,
                                       (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)local_458,local_5a8,
                                       (shared_ptr<boost::filesystem::path> *)&local_308);
                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                      (&local_308._M_refcount);
                            p_Var12 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_458 + 8);
                          }
                          else {
                            std::make_shared<std::__cxx11::string,std::__cxx11::string&>
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_478);
                            std::__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>::
                            __shared_ptr(&local_328,
                                         &path->
                                          super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                        );
                            BuilderExecutable::generateNotification
                                      (&this->super_BuilderExecutable,err_unknownPragma,
                                       (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)local_478,local_5a8,
                                       (shared_ptr<boost::filesystem::path> *)&local_328);
                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                      (&local_328._M_refcount);
                            p_Var12 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_478 + 8);
                          }
LAB_0017b45d:
                          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(p_Var12);
                          goto LAB_0017a5d0;
                        }
                        std::make_shared<std::__cxx11::string,std::__cxx11::string&>
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(local_498 + 0x10));
                        std::__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>::
                        __shared_ptr(&local_338,
                                     &path->
                                      super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                    );
                        BuilderExecutable::generateNotification
                                  (&this->super_BuilderExecutable,err_incompletePragma,
                                   (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)(local_498 + 0x10),local_5a8,
                                   (shared_ptr<boost::filesystem::path> *)&local_338);
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                  (&local_338._M_refcount);
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_480)
                        ;
                      }
                      else {
                        bVar1 = std::operator==(&str,"##");
                        if (((bVar1) || (bVar1 = std::operator==(&str,"#\r"), bVar1)) ||
                           (bVar1 = std::operator==(&str,"##\r"), bVar1)) {
                          std::make_shared<std::__cxx11::string,std::__cxx11::string&>
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_498);
                          std::__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>::
                          __shared_ptr(&local_348,
                                       &path->
                                        super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                      );
                          BuilderExecutable::generateNotification
                                    (&this->super_BuilderExecutable,warn_emptyDirective,
                                     (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)local_498,local_5a8,
                                     (shared_ptr<boost::filesystem::path> *)&local_348);
                          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                    (&local_348._M_refcount);
                          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_498 + 8));
                        }
                        else {
                          std::make_shared<std::__cxx11::string,std::__cxx11::string&>
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(local_4b8 + 0x10));
                          std::__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>::
                          __shared_ptr(&local_358,
                                       &path->
                                        super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                      );
                          BuilderExecutable::generateNotification
                                    (&this->super_BuilderExecutable,err_unknownDirective,
                                     (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)(local_4b8 + 0x10),local_5a8,
                                     (shared_ptr<boost::filesystem::path> *)&local_358);
                          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                    (&local_358._M_refcount);
                          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                    (&local_4a0);
                        }
                      }
                    }
                    break;
                  }
                  uVar5 = std::__cxx11::string::find(cVar11,10);
                  uVar6 = std::__cxx11::string::find(cVar11,0xd);
                  if (uVar6 < uVar5) {
                    std::__cxx11::string::find(cVar11,0xd);
                  }
                  std::__cxx11::string::substr((ulong)&identifier,(ulong)&str);
                  std::make_shared<std::__cxx11::string,std::__cxx11::string&>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_438 + 0x10));
                  std::__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>::
                  __shared_ptr(&local_2e8,
                               &path->
                                super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                              );
                  BuilderExecutable::generateNotification
                            (&this->super_BuilderExecutable,warn_warningDirective,
                             (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)(local_438 + 0x10),local_5a8,
                             (shared_ptr<boost::filesystem::path> *)&local_2e8);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&local_2e8._M_refcount);
                  p_Var12 = &local_420;
                }
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(p_Var12);
              }
            }
          }
        }
        std::__cxx11::string::~string((string *)&identifier);
        break;
      }
      std::__cxx11::string::substr((ulong)&identifier,(ulong)&str);
      std::__cxx11::string::operator=((string *)&str,(string *)&identifier);
      std::__cxx11::string::~string((string *)&identifier);
    }
  } while( true );
}

Assistant:

void Preprocessor::processFile( CodeBase &base, std::shared_ptr<fs::path> path, std::vector<CodeBase::LineContent> &result, std::map<String, String> &definitions, size_t &ifdefCount, bool &ignoreifdef, size_t &posAtIgnore )
	{
		std::ifstream filestream( path->string(), std::ios_base::binary );
		String str;
		size_t lineCount = 0;


		while( filestream && std::getline( filestream, str ) )
		{
			lineCount++;

			//Remove whitespaces
			while( str.size() > 0 && ( str[0] == ' ' || str[0] == '\t' || str[0] == '\r' || str[0] == '\n' ) ) str = str.substr( 1 );

			if( str.size() > 0 )
			{
				if( str[0] == '#' )
				{//Is pp directive
					if( str.size() > 1 )
					{
						if( ignoreifdef )
						{//Is ignoring

							if( str.find( "ifdef" ) == 1 || str.find( "ifndef" ) == 1 )
							{//ifdef/ifndef-directive
								ifdefCount++;
							}
							if( str.find( "elseif" ) == 1 )
							{//elseif-directive
								if( ifdefCount > 0 )
								{
									if( posAtIgnore == ifdefCount )
										ignoreifdef = false;
								}
								else generateNotification( NT::err_elseifWithoutIfdef, std::make_shared<String>( str ), lineCount, path );
							}
							else if( str.find( "endif" ) == 1 )
							{//endif
								if( ifdefCount > 0 )
								{
									if( posAtIgnore == ifdefCount )
										ignoreifdef = false;
									ifdefCount--;
								}
								else generateNotification( NT::err_endifWithoutIfdef, std::make_shared<String>( str ), lineCount, path );
							}
						}
						else
						{
							if( str.find( "define" ) == 1 )
							{//define-directive
								if( str.size() > 8 )
								{
									size_t pos = str.find( '\n' );
									if( str.find( '\r' ) < pos ) pos = str.find( '\r' );
									if( str.find( ' ', 8 ) < pos ) pos = str.find( ' ', 8 );
									String identifier = str.substr( 8, pos - 8 );

									String def;
									if( str.size() > 9 + identifier.size() )
									{
										size_t pos = str.find( '\n' );
										if( str.find( '\r' ) < pos ) pos = str.find( '\r' );
										def = str.substr( 9 + identifier.size(), pos - 9 - identifier.size() );
									}
									definitions[identifier] = def;
								}
								else generateNotification( NT::err_incompleteDefineDirective, std::make_shared<String>( str ), lineCount, path );
							}
							else if( str.find( "undef" ) == 1 )
							{//undef-directive
								if( str.size() > 7 )
								{
									size_t pos = str.find( '\n' );
									if( str.find( '\r' ) < pos ) pos = str.find( '\r' );
									String identifier = str.substr( 7, pos - 7 );
									if( definitions.find( identifier ) != definitions.end() ) definitions.erase( identifier );
									else generateNotification( NT::warn_undefinedIdentifiernAtUndefDirective, std::make_shared<String>( str ), lineCount, path );
								}
								else generateNotification( NT::err_incompleteUndefineDirective, std::make_shared<String>( str ), lineCount, path );
							}
							else if( str.find( "ifdef" ) == 1 )
							{//ifdef-directive
								if( str.size() > 7 )
								{
									size_t pos = str.find( '\n' );
									if( str.find( '\r' ) < pos ) pos = str.find( '\r' );
									String identifier = str.substr( 7, pos - 7 );

									ifdefCount++;
									if( definitions.find( identifier ) == definitions.end() )
									{
										ignoreifdef = true;
										posAtIgnore = ifdefCount;
									}
								}
								else generateNotification( NT::err_elseifWithoutIfdef, std::make_shared<String>( str ), lineCount, path );
							}
							else if( str.find( "ifndef" ) == 1 )
							{//ifndef-directive
								if( str.size() > 8 )
								{
									size_t pos = str.find( '\n' );
									if( str.find( '\r' ) < pos ) pos = str.find( '\r' );
									String identifier = str.substr( 8, pos - 8 );

									ifdefCount++;
									if( definitions.find( identifier ) != definitions.end() )
									{
										ignoreifdef = true;
										posAtIgnore = ifdefCount;
									}
								}
								else generateNotification( NT::err_elseifWithoutIfdef, std::make_shared<String>( str ), lineCount, path );
							}
							else if( str.find( "elseif" ) == 1 )
							{//elseif-directive
								if( ifdefCount > 0 )
								{
									if( !ignoreifdef )
									{
										ignoreifdef = true;
										posAtIgnore = ifdefCount;
									}
									else ignoreifdef = false;
								}
								else generateNotification( NT::err_elseifWithoutIfdef, std::make_shared<String>( str ), lineCount, path );
							}
							else if( str.find( "endif" ) == 1 )
							{//endif
								if( ifdefCount > 0 )
								{
									if( posAtIgnore == ifdefCount )
										ignoreifdef = false;
									ifdefCount--;
								}
								else generateNotification( NT::err_endifWithoutIfdef, std::make_shared<String>( str ), lineCount, path );
							}
							else if( str.find( "error" ) == 1 )
							{//error
								size_t pos = str.find( '\n' );
								if( str.find( '\r' ) < pos ) pos = str.find( '\r' );
								String errorInfo = str.substr( 8, pos - 8 );

								generateNotification( NT::err_errorDirective, std::make_shared<String>( str ), lineCount, path );
							}
							else if( str.find( "warning" ) == 1 )
							{//warning
								size_t pos = str.find( '\n' );
								if( str.find( '\r' ) < pos ) pos = str.find( '\r' );
								String errorInfo = str.substr( 8, pos - 8 );

								generateNotification( NT::warn_warningDirective, std::make_shared<String>( str ), lineCount, path );
							}
							else if( str.find( "include" ) == 1 )
							{//include-directive
								if( str.size() > 10 )
								{
									String filename = str.substr( str.find( '\"', 9 ) + 1 );
									fs::path subPath = fs::path( filename.substr( 0, filename.find( '\"' ) ) );
									if( path->has_parent_path() ) subPath = fs::absolute( subPath, path->parent_path() );
									processFile( base, std::make_shared<fs::path>( subPath ), result, definitions, ifdefCount, ignoreifdef, posAtIgnore );
								}
								else generateNotification( NT::err_incompleteIncludeDirective, std::make_shared<String>( str ), lineCount, path );
							}
							else if( str.find( "pragma" ) == 1 )
							{//pragma-directive
								if( str.size() > 8 )
								{
									size_t pos = str.find( '\n' );
									if( str.find( '\r' ) < pos ) pos = str.find( '\r' );
									if( str.find( ' ', 8 ) < pos ) pos = str.find( ' ', 8 );
									else if( str.find( '=', 8 ) < pos ) pos = str.find( '=', 8 );
									String identifier = str.substr( 8, pos - 8 );

									String def;
									if( str.size() > 9 + identifier.size() )
									{
										size_t pos = str.find( '\n' );
										if( str.find( '\r' ) < pos ) pos = str.find( '\r' );
										def = str.substr( 9 + identifier.size(), pos - 9 - identifier.size() );
									}

									if( identifier == "memmodel" )
									{
										if( def.empty() )
										{
											generateNotification( NT::err_incompleteMemModelPragma, std::make_shared<String>( str ), lineCount, path );
										}
										else if( def == "fast" )
										{
											definitions["byte"] = "fast byte";
											definitions["int"] = "fast int";
										}
										else if( def == "norm" )
										{
											definitions["byte"] = "norm byte";
											definitions["int"] = "norm int";
										}
										else generateNotification( NT::err_unknownMemModelPragma, std::make_shared<String>( str ), lineCount, path );
									}
									else generateNotification( NT::err_unknownPragma, std::make_shared<String>( str ), lineCount, path );
								}
								else generateNotification( NT::err_incompletePragma, std::make_shared<String>( str ), lineCount, path );
							}
							else if( str == "##" || str == "#\r" || str == "##\r" )
								generateNotification( NT::warn_emptyDirective, std::make_shared<String>( str ), lineCount, path );
							else generateNotification( NT::err_unknownDirective, std::make_shared<String>( str ), lineCount, path );
						}
					}
					else generateNotification( NT::warn_emptyDirective, std::make_shared<String>( str ), lineCount, path );
				}
				else
				{
					if( !ignoreifdef )
					{//Is not ignored
						//Remove obsolete carriage returns
						replace( str, String( "\r" ), String() );
						str += '\n';

						//Replace defined constructs
						for( auto &s : definitions )
						{//todo: should not be replaced in string literals!
							replace( str, s.first, s.second );
						}

						//Replace debuggable information
						replace( str, String( "__FILE__" ), path->generic_string() );
						replace( str, String( "__LINE__" ), to_string( lineCount ) );
						replace( str, String( "__TIME__" ), String( "" ) );//todo
						replace( str, String( "__DATE__" ), String( "" ) );//todo

						result.push_back( CodeBase::LineContent( std::make_shared<String>( str ), path, lineCount ) );
					}
				}
			}
		}
	}